

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  int iVar1;
  uint uVar2;
  value_type vVar3;
  bool bVar4;
  deUint32 dVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference rVar9;
  Vector<float,_3> local_b4;
  Vector<float,_3> local_a8;
  deUint32 local_9c;
  undefined1 auStack_98 [4];
  deUint32 shaderID;
  _Bit_type local_90;
  reference local_88;
  value_type local_74;
  int local_70;
  int texNdx;
  int unitNdx;
  allocator<bool> local_5a;
  bool local_59;
  undefined1 local_58 [8];
  vector<bool,_std::allocator<bool>_> isTextureSetUp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  Context *context_local;
  TextureUnitCase *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  iVar1 = this->m_numTextures;
  local_59 = false;
  std::allocator<bool>::allocator(&local_5a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_58,(long)iVar1,&local_59,&local_5a);
  std::allocator<bool>::~allocator(&local_5a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,(long)this->m_numTextures);
  uVar2 = this->m_numTextures;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0);
  (*context->_vptr_Context[7])(context,(ulong)uVar2,pvVar6);
  dVar5 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar5,"Generate textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x48f);
  for (local_70 = 0; local_70 < this->m_numUnits; local_70 = local_70 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_unitTextures,(long)local_70);
    local_74 = *pvVar7;
    (*context->_vptr_Context[4])(context,(ulong)(local_70 + 0x84c0));
    dVar5 = (*context->_vptr_Context[0x79])();
    glu::checkError(dVar5,"Set active texture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                    ,0x497);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_textureTypes,(long)local_74);
    uVar2 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(long)local_74);
    (*context->_vptr_Context[6])(context,(ulong)uVar2,(ulong)*pvVar6);
    dVar5 = (*context->_vptr_Context[0x79])();
    glu::checkError(dVar5,"Bind texture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                    ,0x499);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_58,(long)local_74);
    local_88 = rVar9;
    bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_88);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      uVar2 = *pvVar6;
      pvVar8 = std::
               vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
               ::operator[](&this->m_textureParams,(long)local_74);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar2,0x2802,(ulong)pvVar8->wrapModeS);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      uVar2 = *pvVar6;
      pvVar8 = std::
               vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
               ::operator[](&this->m_textureParams,(long)local_74);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar2,0x2803,(ulong)pvVar8->wrapModeT);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      if (*pvVar6 == 0x806f) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_textureTypes,(long)local_74);
        uVar2 = *pvVar6;
        pvVar8 = std::
                 vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                 ::operator[](&this->m_textureParams,(long)local_74);
        (*context->_vptr_Context[0x1d])(context,(ulong)uVar2,0x8072,(ulong)pvVar8->wrapModeR);
      }
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      uVar2 = *pvVar6;
      pvVar8 = std::
               vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
               ::operator[](&this->m_textureParams,(long)local_74);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar2,0x2801,(ulong)pvVar8->minFilter);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      uVar2 = *pvVar6;
      pvVar8 = std::
               vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
               ::operator[](&this->m_textureParams,(long)local_74);
      (*context->_vptr_Context[0x1d])(context,(ulong)uVar2,0x2800,(ulong)pvVar8->magFilter);
      dVar5 = (*context->_vptr_Context[0x79])();
      glu::checkError(dVar5,"Set texture parameters",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                      ,0x4a5);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_textureTypes,(long)local_74);
      vVar3 = *pvVar6;
      if (vVar3 == 0xde1) {
        upload2dTexture(this,local_74,context);
      }
      else if (vVar3 == 0x806f) {
        upload3dTexture(this,local_74,context);
      }
      else if (vVar3 == 0x8513) {
        uploadCubeTexture(this,local_74,context);
      }
      else if (vVar3 == 0x8c1a) {
        upload2dArrayTexture(this,local_74,context);
      }
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_58,(long)local_74);
      _auStack_98 = rVar9;
      std::_Bit_reference::operator=((_Bit_reference *)auStack_98,true);
    }
  }
  dVar5 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar5,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4b5);
  local_9c = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,local_9c);
  dVar5 = local_9c;
  tcu::Vector<float,_3>::Vector(&local_a8,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_b4,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar5,&local_a8,&local_b4);
  dVar5 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar5,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4c1);
  uVar2 = this->m_numTextures;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0);
  (*context->_vptr_Context[8])(context,(ulong)uVar2,pvVar6);
  dVar5 = (*context->_vptr_Context[0x79])();
  glu::checkError(dVar5,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4c6);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_58)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &isTextureSetUp.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Generate textures");

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		GLU_EXPECT_NO_ERROR(context.getError(), "Set active texture");
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);
		GLU_EXPECT_NO_ERROR(context.getError(), "Bind texture");

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			if (m_textureTypes[texNdx] == GL_TEXTURE_3D)
				context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_R, m_textureParams[texNdx].wrapModeR);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);
			GLU_EXPECT_NO_ERROR(context.getError(), "Set texture parameters");

			switch (m_textureTypes[texNdx])
			{
				case GL_TEXTURE_2D:			upload2dTexture(texNdx, context);		break;
				case GL_TEXTURE_CUBE_MAP:	uploadCubeTexture(texNdx, context);		break;
				case GL_TEXTURE_2D_ARRAY:	upload2dArrayTexture(texNdx, context);	break;
				case GL_TEXTURE_3D:			upload3dTexture(texNdx, context);		break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}